

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,SchnorrPubkey *pubkey)

{
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,"",&local_49);
  Address(this,type,witness_ver,pubkey,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey)
    : Address(type, witness_ver, pubkey, "") {
  // do nothing
}